

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_mod.cpp
# Opt level: O2

void Commands::Dress2(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  Character *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  EquipLocation loc;
  string *this_01;
  bool bVar5;
  allocator<char> local_f1;
  string slot;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar5 = (ulong)((long)(arguments->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arguments->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x41;
  if (bVar5) {
    iVar2 = (*from->_vptr_Command_Source[3])(from);
    this = (Character *)CONCAT44(extraout_var_00,iVar2);
  }
  else {
    iVar2 = (*from->_vptr_Command_Source[4])();
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               (arguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    this = World::GetCharacter((World *)CONCAT44(extraout_var,iVar2),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this == (Character *)0x0) || (this->nowhere == true)) {
    iVar2 = (*from->_vptr_Command_Source[4])(from);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&slot,"character_not_found",(allocator<char> *)&local_d0);
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_01,iVar2) + 0x490),&slot);
    (*from->_vptr_Command_Source[5])(from,&local_70);
    this_01 = &local_70;
LAB_0011b201:
    std::__cxx11::string::~string((string *)this_01);
  }
  else {
    uVar3 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
    iVar2 = (*from->_vptr_Command_Source[4])(from);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&slot,"cmdprotect",(allocator<char> *)&local_d0);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(CONCAT44(extraout_var_02,iVar2) + 0x1f0),&slot);
    iVar2 = util::variant::GetInt(this_00);
    if ((int)(uVar3 & 0xff) < iVar2) {
      std::__cxx11::string::~string((string *)&slot);
    }
    else {
      iVar2 = (**(this->super_Command_Source)._vptr_Command_Source)(this);
      iVar4 = (**from->_vptr_Command_Source)(from);
      std::__cxx11::string::~string((string *)&slot);
      if ((byte)iVar4 < (byte)iVar2) {
        iVar2 = (*from->_vptr_Command_Source[4])(from);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&slot,"command_access_denied",(allocator<char> *)&local_d0);
        I18N::Format<>(&local_90,(I18N *)(CONCAT44(extraout_var_03,iVar2) + 0x490),&slot);
        (*from->_vptr_Command_Source[5])(from,&local_90);
        this_01 = &local_90;
        goto LAB_0011b201;
      }
    }
    uVar1 = (ulong)!bVar5;
    util::lowercase(&slot,(arguments->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar1);
    iVar2 = util::to_int((arguments->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar1 + 1);
    bVar5 = std::operator==(&slot,"hat");
    if (bVar5) {
      loc = Hat;
    }
    else {
      bVar5 = std::operator==(&slot,"armor");
      if (bVar5) {
        loc = Armor;
      }
      else {
        bVar5 = std::operator==(&slot,"boots");
        loc = Boots;
        if (!bVar5) {
          bVar5 = std::operator==(&slot,"weapon");
          if (bVar5) {
            loc = Weapon;
          }
          else {
            bVar5 = std::operator==(&slot,"shield");
            if (!bVar5) {
              iVar2 = (*from->_vptr_Command_Source[4])(from);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"invalid_dress_slot",&local_f1);
              I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_04,iVar2) + 0x490),&local_d0);
              (*from->_vptr_Command_Source[5])(from,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              this_01 = &local_d0;
              goto LAB_0011b201;
            }
            loc = Shield;
          }
        }
      }
    }
    Character::Dress(this,loc,(unsigned_short)iVar2);
  }
  std::__cxx11::string::~string((string *)&slot);
  return;
}

Assistant:

void Dress2(const std::vector<std::string>& arguments, Command_Source* from)
{
	int argp = 0;
	Character *victim;

	if (arguments.size() > 2)
		victim = from->SourceWorld()->GetCharacter(arguments[argp++]);
	else
		victim = from->SourceCharacter();

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
		return;
	}

	if (victim->SourceAccess() >= int(from->SourceWorld()->admin_config["cmdprotect"])
	 && victim->SourceAccess() > from->SourceAccess())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("command_access_denied"));
		return;
	}

	std::string slot = util::lowercase(arguments[argp++]);
	int gfx_id = util::to_int(arguments[argp++]);

		 if (slot == "hat")    victim->Dress(Character::Hat, gfx_id);
	else if (slot == "armor")  victim->Dress(Character::Armor, gfx_id);
	else if (slot == "boots")  victim->Dress(Character::Boots, gfx_id);
	else if (slot == "weapon") victim->Dress(Character::Weapon, gfx_id);
	else if (slot == "shield") victim->Dress(Character::Shield, gfx_id);
	else from->ServerMsg(from->SourceWorld()->i18n.Format("invalid_dress_slot"));
}